

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void dumpCKC(unsigned_long cka,int size)

{
  string msg;
  unsigned_long local_38;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  local_38 = cka;
  if (CKC_table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    fill_CKC_table(&CKC_table_abi_cxx11_);
  }
  local_28 = 0;
  local_20[0] = 0;
  local_30 = local_20;
  std::
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::at(&CKC_table_abi_cxx11_,&local_38);
  std::__cxx11::string::_M_assign((string *)&local_30);
  printf("%.*s",size,local_30);
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  return;
}

Assistant:

void dumpCKC(unsigned long cka, int size)
{
	// Lazy fill
	if (CKC_table.empty())
	{
		fill_CKC_table(CKC_table);
	}
	std::string msg;
	try
	{
		msg = CKC_table.at(cka);
		printf("%.*s", size, msg.c_str());
	}
	catch (const std::out_of_range&)
	{
		if (cka & CKC_VENDOR_DEFINED)
		{
			cka &= ~CKC_VENDOR_DEFINED;
			printf("CKC_VENDOR_DEFINED | 0x%lx", cka);
		}
		else
		{
			printf("unknown 0x%lx", cka);
		}
	}
}